

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall DPolyAction::Destroy(DPolyAction *this)

{
  FPolyObj *pFVar1;
  DPolyAction *pDVar2;
  
  pFVar1 = PO_GetPolyobj(this->m_PolyObj);
  pDVar2 = GC::ReadBarrier<DPolyAction>((DPolyAction **)&pFVar1->specialdata);
  if (pDVar2 == this) {
    (pFVar1->specialdata).field_0.p = (DPolyAction *)0x0;
  }
  StopInterpolation(this);
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DPolyAction::Destroy()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly->specialdata == this)
	{
		poly->specialdata = NULL;
	}

	StopInterpolation();
	Super::Destroy();
}